

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmap.cpp
# Opt level: O1

int main(void)

{
  TinyGC::AttachMainThread(tg);
  test1();
  test2();
  test3();
  test4();
  TinyGC::DetachMainThread(tg);
  return 0;
}

Assistant:

int main() {
  tg.AttachMainThread();
  test1();
  test2();
  test3();
  test4();
  tg.DetachMainThread();
}